

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O3

void __thiscall Imf_3_2::AcesInputFile::Data::initColorConversion(Data *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  bool bVar4;
  Header *header;
  Chromaticities *pCVar5;
  V2f *pVVar6;
  Box2i *pBVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  undefined8 in_XMM1_Qa;
  undefined1 auVar16 [16];
  undefined8 in_XMM3_Qa;
  undefined1 auVar17 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  V2f local_218;
  float local_208;
  undefined8 local_1f8;
  Chromaticities local_1d8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  Chromaticities local_c8;
  V2f local_a0;
  M44f local_98;
  M44f local_50;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  header = RgbaInputFile::header(this->rgbaFile);
  local_50.x[0][0] = 0.64;
  local_50.x[0][1] = 0.33;
  local_98.x[0][0] = 0.3;
  local_98.x[0][1] = 0.6;
  local_c8.red.x = 0.15;
  local_c8.red.y = 0.06;
  local_a0.x = 0.3127;
  local_a0.y = 0.329;
  Chromaticities::Chromaticities
            (&local_1d8,(V2f *)&local_50,(V2f *)&local_98,&local_c8.red,&local_a0);
  bVar4 = hasChromaticities(header);
  if (bVar4) {
    pCVar5 = chromaticities(header);
    local_1d8.red = pCVar5->red;
    local_1d8.green = pCVar5->green;
    local_1d8.blue.x = (pCVar5->blue).x;
    local_1d8.blue.y = (pCVar5->blue).y;
    local_208 = (pCVar5->white).y;
    local_1d8.white = pCVar5->white;
    auVar2._4_8_ = in_XMM1_Qa;
    auVar2._0_4_ = local_1d8.blue.y;
    auVar12._0_8_ = auVar2._0_8_ << 0x20;
    auVar12._8_4_ = (pCVar5->white).x;
    auVar12._12_4_ = local_208;
    local_218 = auVar12._8_8_;
  }
  else {
    local_218 = (V2f)((ulong)local_1d8.white & 0xffffffff);
    local_208 = local_1d8.white.y;
  }
  bVar4 = hasAdoptedNeutral(header);
  if (bVar4) {
    pVVar6 = adoptedNeutral(header);
    local_1d8.white = *pVVar6;
    local_208 = local_1d8.white.y;
    local_218 = local_1d8.white;
  }
  acesChromaticities();
  fVar14 = acesChromaticities::acesChr.white.y;
  fVar8 = acesChromaticities::acesChr.white.x;
  local_c8.red.y = acesChromaticities::acesChr.red.y;
  local_c8.red.x = acesChromaticities::acesChr.red.x;
  local_c8.green.x = acesChromaticities::acesChr.green.x;
  local_c8.green.y = acesChromaticities::acesChr.green.y;
  local_c8.blue.x = acesChromaticities::acesChr.blue.x;
  local_c8.blue.y = acesChromaticities::acesChr.blue.y;
  local_c8.white.x = acesChromaticities::acesChr.white.x;
  local_c8.white.y = acesChromaticities::acesChr.white.y;
  auVar3._4_8_ = in_XMM3_Qa;
  auVar3._0_4_ = acesChromaticities::acesChr.blue.y;
  auVar20._0_8_ = auVar3._0_8_ << 0x20;
  auVar20._8_4_ = acesChromaticities::acesChr.white.x;
  auVar20._12_4_ = acesChromaticities::acesChr.white.y;
  if ((local_1d8.red.x == acesChromaticities::acesChr.red.x) &&
     (!NAN(local_1d8.red.x) && !NAN(acesChromaticities::acesChr.red.x))) {
    if ((local_1d8.red.y == acesChromaticities::acesChr.red.y) &&
       (!NAN(local_1d8.red.y) && !NAN(acesChromaticities::acesChr.red.y))) {
      if ((local_1d8.green.x == acesChromaticities::acesChr.green.x) &&
         (!NAN(local_1d8.green.x) && !NAN(acesChromaticities::acesChr.green.x))) {
        if ((local_1d8.green.y == acesChromaticities::acesChr.green.y) &&
           (!NAN(local_1d8.green.y) && !NAN(acesChromaticities::acesChr.green.y))) {
          if ((local_1d8.blue.x == acesChromaticities::acesChr.blue.x) &&
             (!NAN(local_1d8.blue.x) && !NAN(acesChromaticities::acesChr.blue.x))) {
            if ((local_1d8.blue.y == acesChromaticities::acesChr.blue.y) &&
               (!NAN(local_1d8.blue.y) && !NAN(acesChromaticities::acesChr.blue.y))) {
              if ((local_1d8.white.x == acesChromaticities::acesChr.white.x) &&
                 (!NAN(local_1d8.white.x) && !NAN(acesChromaticities::acesChr.white.x))) {
                if ((local_1d8.white.y == acesChromaticities::acesChr.white.y) &&
                   (!NAN(local_1d8.white.y) && !NAN(acesChromaticities::acesChr.white.y))) {
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  this->mustConvertColor = true;
  pBVar7 = Header::dataWindow(header);
  this->minX = (pBVar7->min).x;
  pBVar7 = Header::dataWindow(header);
  auVar18._12_4_ = (undefined4)((ulong)local_1f8 >> 0x20);
  auVar18._8_4_ = fVar14;
  auVar18._0_8_ = auVar20._8_8_;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._4_4_ = local_218.x;
  auVar17._0_4_ = fVar8;
  auVar19._0_12_ = auVar17._0_12_;
  auVar19._12_4_ = local_218.y;
  auVar35._4_4_ = local_208;
  auVar35._0_4_ = fVar14;
  auVar35._8_4_ = fVar14;
  auVar35._12_4_ = fVar14;
  auVar20 = divps(auVar19,auVar35);
  auVar11._0_4_ = (1.0 - fVar8) - fVar14;
  auVar11._4_4_ = (1.0 - local_218.x) - local_208;
  auVar11._8_4_ = (0.0 - fVar14) - fVar14;
  auVar11._12_4_ = (0.0 - local_218.y) - fVar14;
  auVar1._4_4_ = local_208;
  auVar1._0_4_ = fVar14;
  auVar1._8_4_ = fVar14;
  auVar1._12_4_ = fVar14;
  auVar12 = divps(auVar11,auVar1);
  fVar22 = auVar20._0_4_;
  fVar25 = auVar20._4_4_;
  fVar28 = auVar20._8_4_;
  fVar10 = auVar20._12_4_;
  fVar8 = auVar12._0_4_;
  fVar14 = auVar12._4_4_;
  fVar32 = auVar12._8_4_;
  fVar9 = auVar12._12_4_;
  auVar21._0_4_ = fVar8 * 0.0 + fVar22 * 0.0 + 0.0 + 1.0;
  auVar21._4_4_ = fVar14 * 0.0 + fVar25 * 0.0 + 0.0 + 1.0;
  auVar21._8_4_ = fVar32 * 0.0 + fVar28 * 0.0 + 0.0 + 0.0;
  auVar21._12_4_ = fVar9 * 0.0 + fVar10 * 0.0 + 0.0 + 0.0;
  auVar34._0_4_ = fVar8 * 1.0296 + fVar22 * 0.0389 + -0.0685 + 0.0;
  auVar34._4_4_ = fVar14 * 1.0296 + fVar25 * 0.0389 + -0.0685 + 0.0;
  auVar34._8_4_ = fVar32 * 0.0 + fVar28 * 0.0 + 0.0 + 0.0;
  auVar34._12_4_ = fVar9 * 0.0 + fVar10 * 0.0 + 0.0 + 0.0;
  auVar16._0_4_ = fVar8 * -0.1614 + fVar22 * (float)0x3f652546 + 0.2664 + 0.0;
  auVar16._4_4_ = fVar14 * -0.1614 + fVar25 * (float)0x3f652546 + 0.2664 + 0.0;
  auVar16._8_4_ = fVar32 * 0.0 + fVar28 * 0.0 + 0.0 + 0.0;
  auVar16._12_4_ = fVar9 * 0.0 + fVar10 * 0.0 + 0.0 + 0.0;
  auVar20 = divps(auVar16,auVar21);
  auVar13._0_4_ = fVar8 * 0.0367 + fVar22 * -0.7502 + 1.7135 + 0.0;
  auVar13._4_4_ = fVar14 * 0.0367 + fVar25 * -0.7502 + 1.7135 + 0.0;
  auVar13._8_4_ = fVar32 * 0.0 + fVar28 * 0.0 + 0.0 + 0.0;
  auVar13._12_4_ = fVar9 * 0.0 + fVar10 * 0.0 + 0.0 + 0.0;
  auVar12 = divps(auVar13,auVar21);
  auVar35 = divps(auVar34,auVar21);
  fVar14 = auVar20._0_4_ / auVar20._4_4_;
  fVar8 = auVar12._0_4_ / auVar12._4_4_;
  local_198._4_12_ = auVar35._4_12_;
  fVar32 = auVar35._0_4_ / auVar35._4_4_;
  fVar25 = fVar14 * 0.8951 + 0.0;
  fVar28 = fVar8 * -0.7502 + 0.0;
  fVar22 = fVar32 * 0.0389 + 0.0 + 0.0;
  fVar26 = fVar14 * 0.2664 + 0.0 + 0.0;
  fVar29 = fVar8 * 1.7135 + 0.0;
  fVar23 = fVar32 * -0.0685 + 0.0 + 0.0;
  fVar27 = fVar14 * -0.1614 + 0.0 + 0.0;
  fVar30 = fVar8 * 0.0367 + 0.0;
  fVar24 = fVar32 * 1.0296 + 0.0 + 0.0;
  fVar15 = fVar14 * 0.0 + 0.0 + 0.0;
  fVar8 = fVar8 * 0.0 + 0.0;
  fVar33 = fVar32 * 0.0 + 0.0 + 0.0;
  fVar14 = fVar22 * 0.159963 + fVar25 * 0.986993 + fVar28 * -0.147054 + 0.0;
  fVar32 = fVar22 * 0.049291 + fVar25 * 0.432305 + fVar28 * 0.51836 + 0.0;
  fVar9 = fVar22 * 0.968487 + fVar25 * -0.008529 + fVar28 * 0.040043 + 0.0;
  fVar22 = fVar22 * 0.0 + fVar25 * 0.0 + fVar28 * 0.0 + 0.0;
  fVar25 = fVar23 * 0.159963 + fVar26 * 0.986993 + fVar29 * -0.147054 + 0.0;
  fVar28 = fVar23 * 0.049291 + fVar26 * 0.432305 + fVar29 * 0.51836 + 0.0;
  fVar10 = fVar23 * 0.968487 + fVar26 * -0.008529 + fVar29 * 0.040043 + 0.0;
  fVar23 = fVar23 * 0.0 + fVar26 * 0.0 + fVar29 * 0.0 + 0.0;
  fVar26 = fVar24 * 0.159963 + fVar27 * 0.986993 + fVar30 * -0.147054 + 0.0;
  fVar29 = fVar24 * 0.049291 + fVar27 * 0.432305 + fVar30 * 0.51836 + 0.0;
  fVar31 = fVar24 * 0.968487 + fVar27 * -0.008529 + fVar30 * 0.040043 + 0.0;
  fVar24 = fVar24 * 0.0 + fVar27 * 0.0 + fVar30 * 0.0 + 0.0;
  fVar27 = fVar33 * 0.159963 + fVar15 * 0.986993 + fVar8 * -0.147054 + 0.0;
  local_1b8 = ZEXT416((uint)(fVar33 * 0.049291 + fVar15 * 0.432305 + fVar8 * 0.51836 + 0.0));
  local_1a8 = ZEXT416((uint)(fVar33 * 0.968487 + fVar15 * -0.008529 + fVar8 * 0.040043 + 0.0));
  this->maxX = (pBVar7->max).x;
  local_198._0_4_ = fVar33 * 0.0 + fVar15 * 0.0 + fVar8 * 0.0 + 1.0;
  RGBtoXYZ(&local_50,&local_1d8,1.0);
  local_d8 = ZEXT416((uint)(local_50.x[0][3] * fVar27 +
                           local_50.x[0][2] * fVar26 +
                           local_50.x[0][0] * fVar14 + fVar25 * local_50.x[0][1]));
  local_f8 = ZEXT416((uint)(local_50.x[0][3] * (float)local_1b8._0_4_ +
                           local_50.x[0][2] * fVar29 +
                           local_50.x[0][0] * fVar32 + fVar28 * local_50.x[0][1]));
  local_e8 = ZEXT416((uint)(local_50.x[0][3] * (float)local_1a8._0_4_ +
                           local_50.x[0][2] * fVar31 +
                           local_50.x[0][0] * fVar9 + fVar10 * local_50.x[0][1]));
  local_108 = ZEXT416((uint)(local_50.x[0][3] * (float)local_198._0_4_ +
                            local_50.x[0][2] * fVar24 +
                            local_50.x[0][0] * fVar22 + local_50.x[0][1] * fVar23));
  local_118 = ZEXT416((uint)(local_50.x[1][3] * fVar27 +
                            local_50.x[1][2] * fVar26 +
                            local_50.x[1][0] * fVar14 + fVar25 * local_50.x[1][1]));
  local_128 = ZEXT416((uint)(local_50.x[1][3] * (float)local_1b8._0_4_ +
                            local_50.x[1][2] * fVar29 +
                            local_50.x[1][0] * fVar32 + fVar28 * local_50.x[1][1]));
  local_138 = ZEXT416((uint)(local_50.x[1][3] * (float)local_1a8._0_4_ +
                            local_50.x[1][2] * fVar31 +
                            local_50.x[1][0] * fVar9 + fVar10 * local_50.x[1][1]));
  local_148 = ZEXT416((uint)(local_50.x[1][3] * (float)local_198._0_4_ +
                            local_50.x[1][2] * fVar24 +
                            local_50.x[1][0] * fVar22 + local_50.x[1][1] * fVar23));
  local_158 = ZEXT416((uint)(local_50.x[2][3] * fVar27 +
                            local_50.x[2][2] * fVar26 +
                            local_50.x[2][0] * fVar14 + fVar25 * local_50.x[2][1]));
  local_168 = ZEXT416((uint)(local_50.x[2][3] * (float)local_1b8._0_4_ +
                            local_50.x[2][2] * fVar29 +
                            local_50.x[2][0] * fVar32 + fVar28 * local_50.x[2][1]));
  local_178 = ZEXT416((uint)(local_50.x[2][3] * (float)local_1a8._0_4_ +
                            local_50.x[2][2] * fVar31 +
                            local_50.x[2][0] * fVar9 + fVar10 * local_50.x[2][1]));
  local_188 = ZEXT416((uint)(local_50.x[2][3] * (float)local_198._0_4_ +
                            local_50.x[2][2] * fVar24 +
                            local_50.x[2][0] * fVar22 + local_50.x[2][1] * fVar23));
  fVar8 = fVar27 * local_50.x[3][3] +
          fVar26 * local_50.x[3][2] + fVar14 * local_50.x[3][0] + fVar25 * local_50.x[3][1];
  local_1b8._0_4_ =
       (float)local_1b8._0_4_ * local_50.x[3][3] +
       fVar29 * local_50.x[3][2] + fVar32 * local_50.x[3][0] + fVar28 * local_50.x[3][1];
  local_1a8._0_4_ =
       (float)local_1a8._0_4_ * local_50.x[3][3] +
       fVar31 * local_50.x[3][2] + fVar9 * local_50.x[3][0] + fVar10 * local_50.x[3][1];
  local_198._0_4_ =
       (float)local_198._0_4_ * local_50.x[3][3] +
       fVar24 * local_50.x[3][2] + fVar22 * local_50.x[3][0] + fVar23 * local_50.x[3][1];
  XYZtoRGB(&local_98,&local_c8,1.0);
  (this->fileToAces).x[0][0] =
       (float)local_108._0_4_ * local_98.x[3][0] +
       (float)local_e8._0_4_ * local_98.x[2][0] +
       (float)local_d8._0_4_ * local_98.x[0][0] + (float)local_f8._0_4_ * local_98.x[1][0];
  (this->fileToAces).x[0][1] =
       (float)local_108._0_4_ * local_98.x[3][1] +
       (float)local_e8._0_4_ * local_98.x[2][1] +
       (float)local_d8._0_4_ * local_98.x[0][1] + (float)local_f8._0_4_ * local_98.x[1][1];
  (this->fileToAces).x[0][2] =
       (float)local_108._0_4_ * local_98.x[3][2] +
       (float)local_e8._0_4_ * local_98.x[2][2] +
       (float)local_d8._0_4_ * local_98.x[0][2] + (float)local_f8._0_4_ * local_98.x[1][2];
  (this->fileToAces).x[0][3] =
       (float)local_108._0_4_ * local_98.x[3][3] +
       (float)local_e8._0_4_ * local_98.x[2][3] +
       (float)local_d8._0_4_ * local_98.x[0][3] + (float)local_f8._0_4_ * local_98.x[1][3];
  (this->fileToAces).x[1][0] =
       (float)local_148._0_4_ * local_98.x[3][0] +
       (float)local_138._0_4_ * local_98.x[2][0] +
       (float)local_118._0_4_ * local_98.x[0][0] + (float)local_128._0_4_ * local_98.x[1][0];
  (this->fileToAces).x[1][1] =
       (float)local_148._0_4_ * local_98.x[3][1] +
       (float)local_138._0_4_ * local_98.x[2][1] +
       (float)local_118._0_4_ * local_98.x[0][1] + (float)local_128._0_4_ * local_98.x[1][1];
  (this->fileToAces).x[1][2] =
       (float)local_148._0_4_ * local_98.x[3][2] +
       (float)local_138._0_4_ * local_98.x[2][2] +
       (float)local_118._0_4_ * local_98.x[0][2] + (float)local_128._0_4_ * local_98.x[1][2];
  (this->fileToAces).x[1][3] =
       (float)local_148._0_4_ * local_98.x[3][3] +
       (float)local_138._0_4_ * local_98.x[2][3] +
       (float)local_118._0_4_ * local_98.x[0][3] + (float)local_128._0_4_ * local_98.x[1][3];
  (this->fileToAces).x[2][0] =
       (float)local_188._0_4_ * local_98.x[3][0] +
       (float)local_178._0_4_ * local_98.x[2][0] +
       (float)local_158._0_4_ * local_98.x[0][0] + (float)local_168._0_4_ * local_98.x[1][0];
  (this->fileToAces).x[2][1] =
       (float)local_188._0_4_ * local_98.x[3][1] +
       (float)local_178._0_4_ * local_98.x[2][1] +
       (float)local_158._0_4_ * local_98.x[0][1] + (float)local_168._0_4_ * local_98.x[1][1];
  (this->fileToAces).x[2][2] =
       (float)local_188._0_4_ * local_98.x[3][2] +
       (float)local_178._0_4_ * local_98.x[2][2] +
       (float)local_158._0_4_ * local_98.x[0][2] + (float)local_168._0_4_ * local_98.x[1][2];
  (this->fileToAces).x[2][3] =
       (float)local_188._0_4_ * local_98.x[3][3] +
       (float)local_178._0_4_ * local_98.x[2][3] +
       (float)local_158._0_4_ * local_98.x[0][3] + (float)local_168._0_4_ * local_98.x[1][3];
  (this->fileToAces).x[3][0] =
       (float)local_198._0_4_ * local_98.x[3][0] +
       (float)local_1a8._0_4_ * local_98.x[2][0] +
       fVar8 * local_98.x[0][0] + (float)local_1b8._0_4_ * local_98.x[1][0];
  (this->fileToAces).x[3][1] =
       (float)local_198._0_4_ * local_98.x[3][1] +
       (float)local_1a8._0_4_ * local_98.x[2][1] +
       fVar8 * local_98.x[0][1] + (float)local_1b8._0_4_ * local_98.x[1][1];
  (this->fileToAces).x[3][2] =
       (float)local_198._0_4_ * local_98.x[3][2] +
       (float)local_1a8._0_4_ * local_98.x[2][2] +
       fVar8 * local_98.x[0][2] + (float)local_1b8._0_4_ * local_98.x[1][2];
  (this->fileToAces).x[3][3] =
       (float)local_198._0_4_ * local_98.x[3][3] +
       (float)local_1a8._0_4_ * local_98.x[2][3] +
       fVar8 * local_98.x[0][3] + (float)local_1b8._0_4_ * local_98.x[1][3];
  return;
}

Assistant:

void
AcesInputFile::Data::initColorConversion ()
{
    const Header& header = rgbaFile->header ();

    Chromaticities fileChr;

    if (hasChromaticities (header)) fileChr = chromaticities (header);

    V2f fileNeutral = fileChr.white;

    if (hasAdoptedNeutral (header))
    {
        fileNeutral   = adoptedNeutral (header);
        fileChr.white = fileNeutral; // for RGBtoXYZ() purposes.
    }

    const Chromaticities acesChr = acesChromaticities ();

    V2f acesNeutral = acesChr.white;

    if (fileChr.red == acesChr.red && fileChr.green == acesChr.green &&
        fileChr.blue == acesChr.blue && fileChr.white == acesChr.white)
    {
        //
        // The file already contains ACES data,
        // color conversion is not necessary.

        return;
    }

    mustConvertColor = true;
    minX             = header.dataWindow ().min.x;
    maxX             = header.dataWindow ().max.x;

    //
    // Create a matrix that transforms colors from the
    // RGB space of the input file into the ACES space
    // using a color adaptation transform to move the
    // white point.
    //

    //
    // We'll need the Bradford cone primary matrix and its inverse
    //

    static const M44f bradfordCPM (
        0.895100f,
        -0.750200f,
        0.038900f,
        0.000000f,
        0.266400f,
        1.713500f,
        -0.068500f,
        0.000000f,
        -0.161400f,
        0.036700f,
        1.029600f,
        0.000000f,
        0.000000f,
        0.000000f,
        0.000000f,
        1.000000f);

    const static M44f inverseBradfordCPM (
        0.986993f,
        0.432305f,
        -0.008529f,
        0.000000f,
        -0.147054f,
        0.518360f,
        0.040043f,
        0.000000f,
        0.159963f,
        0.049291f,
        0.968487f,
        0.000000f,
        0.000000f,
        0.000000f,
        0.000000f,
        1.000000f);

    //
    // Convert the white points of the two RGB spaces to XYZ
    //

    float fx = fileNeutral.x;
    float fy = fileNeutral.y;
    V3f   fileNeutralXYZ (fx / fy, 1, (1 - fx - fy) / fy);

    float ax = acesNeutral.x;
    float ay = acesNeutral.y;
    V3f   acesNeutralXYZ (ax / ay, 1, (1 - ax - ay) / ay);

    //
    // Compute the Bradford transformation matrix
    //

    V3f ratio ((acesNeutralXYZ * bradfordCPM) / (fileNeutralXYZ * bradfordCPM));

    M44f ratioMat (
        ratio[0], 0, 0, 0, 0, ratio[1], 0, 0, 0, 0, ratio[2], 0, 0, 0, 0, 1);

    M44f bradfordTrans = bradfordCPM * ratioMat * inverseBradfordCPM;

    //
    // Build a combined file-RGB-to-ACES-RGB conversion matrix
    //

    fileToAces = RGBtoXYZ (fileChr, 1) * bradfordTrans * XYZtoRGB (acesChr, 1);
}